

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O0

int dired(int f,int n)

{
  char *pcVar1;
  buffer *bp_00;
  buffer *bp;
  char *slash;
  char *bufp;
  char dname [1024];
  int n_local;
  int f_local;
  
  dname._1020_4_ = n;
  if (curbp->b_fname[0] == '\0') {
    pcVar1 = getcwd((char *)&bufp,0x400);
    if (pcVar1 == (char *)0x0) {
      bufp._0_1_ = 0;
    }
  }
  else {
    strlcpy(&bufp,curbp->b_fname,0x400);
    pcVar1 = strrchr((char *)&bufp,0x2f);
    if (pcVar1 != (char *)0x0) {
      pcVar1[1] = '\0';
    }
  }
  pcVar1 = eread("Dired (directory): ",(char *)&bufp,0x400,0x38);
  if (pcVar1 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar1 == '\0') {
    n_local = 0;
  }
  else {
    bp_00 = dired_(pcVar1);
    if (bp_00 == (buffer *)0x0) {
      n_local = 0;
    }
    else {
      curbp = bp_00;
      n_local = showbuffer(bp_00,curwp,0x18);
    }
  }
  return n_local;
}

Assistant:

int
dired(int f, int n)
{
	char		 dname[NFILEN], *bufp, *slash;
	struct buffer	*bp;

	if (curbp->b_fname[0] != '\0') {
		(void)strlcpy(dname, curbp->b_fname, sizeof(dname));
		if ((slash = strrchr(dname, '/')) != NULL) {
			*(slash + 1) = '\0';
		}
	} else {
		if (getcwd(dname, sizeof(dname)) == NULL)
			dname[0] = '\0';
	}

	if ((bufp = eread("Dired (directory): ", dname, NFILEN,
	    EFDEF | EFNEW | EFCR)) == NULL)
		return (ABORT);
	if (bufp[0] == '\0')
		return (FALSE);
	if ((bp = dired_(bufp)) == NULL)
		return (FALSE);

	curbp = bp;
	return (showbuffer(bp, curwp, WFFULL | WFMODE));
}